

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

node_type * __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
::new_internal_node(btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    *this,node_type *parent)

{
  size_type sz;
  node_type *n;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar1;
  node_type *p;
  node_type *parent_local;
  btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *this_local;
  
  sz = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
       ::InternalSize();
  n = allocate(this,sz);
  pbVar1 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
           ::init_internal(n,parent);
  return pbVar1;
}

Assistant:

node_type* new_internal_node(node_type *parent) {
            node_type *p = allocate(node_type::InternalSize());
            return node_type::init_internal(p, parent);
        }